

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reslist.cpp
# Opt level: O3

ArrayResource * array_open(SRBRoot *bundle,char *tag,UString *comment,UErrorCode *status)

{
  ArrayResource *this;
  
  this = (ArrayResource *)operator_new(0x50);
  SResource::SResource((SResource *)this,bundle,tag,'\b',comment,status);
  (this->super_ContainerResource).fCount = 0;
  (this->super_ContainerResource).fFirst = (SResource *)0x0;
  this->fLast = (SResource *)0x0;
  (this->super_ContainerResource).super_SResource._vptr_SResource =
       (_func_int **)&PTR__ArrayResource_00471548;
  if (U_ZERO_ERROR < *status) {
    ArrayResource::~ArrayResource(this);
    operator_delete(this);
    this = (ArrayResource *)0x0;
  }
  return this;
}

Assistant:

ArrayResource* array_open(struct SRBRoot *bundle, const char *tag, const struct UString* comment, UErrorCode *status) {
    LocalPointer<ArrayResource> res(new ArrayResource(bundle, tag, comment, *status), *status);
    return U_SUCCESS(*status) ? res.orphan() : NULL;
}